

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageIO.cpp
# Opt level: O1

void Imf_3_2::anon_unknown_21::saveLevel(TiledOutputFile *out,FlatImage *img,int x,int y)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  const_iterator cVar3;
  ConstIterator CVar4;
  int iVar5;
  FrameBuffer fb;
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  local_98;
  undefined1 local_68 [56];
  
  iVar1 = (*(img->super_Image)._vptr_Image[6])(img,(ulong)(uint)x,(ulong)(uint)y);
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  cVar3._M_node = (_Base_ptr)FlatImageLevel::begin((FlatImageLevel *)CONCAT44(extraout_var,iVar1));
  while( true ) {
    CVar4 = FlatImageLevel::end((FlatImageLevel *)CONCAT44(extraout_var,iVar1));
    if ((const_iterator)cVar3._M_node == CVar4._i._M_node) break;
    (**(code **)(**(long **)(cVar3._M_node + 2) + 0x20))(local_68);
    Imf_3_2::FrameBuffer::insert((string *)&local_98,(Slice *)(cVar3._M_node + 1));
    cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node);
  }
  Imf_3_2::TiledOutputFile::setFrameBuffer((FrameBuffer *)out);
  iVar5 = (int)out;
  iVar1 = Imf_3_2::TiledOutputFile::numXTiles(iVar5);
  iVar2 = Imf_3_2::TiledOutputFile::numYTiles(iVar5);
  Imf_3_2::TiledOutputFile::writeTiles(iVar5,0,iVar1 + -1,0,iVar2 + -1,x);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree(&local_98);
  return;
}

Assistant:

void
saveLevel (TiledOutputFile& out, const FlatImage& img, int x, int y)
{
    const FlatImageLevel& level = img.level (x, y);
    FrameBuffer           fb;

    for (FlatImageLevel::ConstIterator i = level.begin (); i != level.end ();
         ++i)
        fb.insert (i.name (), i.channel ().slice ());

    out.setFrameBuffer (fb);
    out.writeTiles (0, out.numXTiles (x) - 1, 0, out.numYTiles (y) - 1, x, y);
}